

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void new_localvar(LexState *ls,TString *name,int n)

{
  undefined2 uVar1;
  int iVar2;
  FuncState *fs_00;
  Proto *pPVar3;
  global_State *g;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  LocVar *pLVar6;
  long lVar7;
  long lVar8;
  LocVar *pLVar9;
  FuncState *fs;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  fs_00 = ls->fs;
  if ((int)((uint)fs_00->nactvar + n) < 200) {
    pPVar3 = fs_00->f;
    iVar2 = pPVar3->sizelocvars;
    if (fs_00->nlocvars < iVar2) {
      pLVar6 = pPVar3->locvars;
    }
    else {
      pLVar6 = (LocVar *)
               luaM_growaux_(ls->L,pPVar3->locvars,&pPVar3->sizelocvars,0x10,0x7fff,
                             "too many local variables");
      pPVar3->locvars = pLVar6;
      auVar5 = _DAT_00115030;
      auVar4 = _DAT_00115020;
      if (iVar2 < pPVar3->sizelocvars) {
        lVar7 = (long)pPVar3->sizelocvars - (long)iVar2;
        lVar8 = lVar7 + -1;
        auVar11._8_4_ = (int)lVar8;
        auVar11._0_8_ = lVar8;
        auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
        pLVar9 = pLVar6 + (long)iVar2 + 1;
        uVar10 = 0;
        auVar11 = auVar11 ^ _DAT_00115030;
        do {
          auVar12._8_4_ = (int)uVar10;
          auVar12._0_8_ = uVar10;
          auVar12._12_4_ = (int)(uVar10 >> 0x20);
          auVar12 = (auVar12 | auVar4) ^ auVar5;
          if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                      auVar11._4_4_ < auVar12._4_4_) & 1)) {
            pLVar9[-1].varname = (TString *)0x0;
          }
          if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
              auVar12._12_4_ <= auVar11._12_4_) {
            pLVar9->varname = (TString *)0x0;
          }
          uVar10 = uVar10 + 2;
          pLVar9 = pLVar9 + 2;
        } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar10);
      }
    }
    pLVar6[fs_00->nlocvars].varname = name;
    if ((((name->tsv).marked & 3) != 0) && ((pPVar3->marked & 4) != 0)) {
      g = ls->L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,(GCObject *)name);
      }
      else {
        pPVar3->marked = g->currentwhite & 3 | pPVar3->marked & 0xf8;
      }
    }
    uVar1 = fs_00->nlocvars;
    fs_00->nlocvars = uVar1 + 1;
    fs_00->actvar[(long)n + (ulong)fs_00->nactvar] = uVar1;
    return;
  }
  errorlimit(fs_00,200,"local variables");
}

Assistant:

static void new_localvar(LexState*ls,TString*name,int n){
FuncState*fs=ls->fs;
luaY_checklimit(fs,fs->nactvar+n+1,200,"local variables");
fs->actvar[fs->nactvar+n]=cast(unsigned short,registerlocalvar(ls,name));
}